

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuRasterizationVerifier.cpp
# Opt level: O0

Vec2 __thiscall
tcu::anon_unknown_3::getLineCoordAtAxisCoord
          (anon_unknown_3 *this,Vec2 *pa,Vec2 *pb,bool isXAxis,float axisCoord)

{
  float fVar1;
  float fVar2;
  Vec2 VVar3;
  uint ndx;
  uint ndx_00;
  float *pfVar4;
  float fVar5;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float fVar6;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  float fVar7;
  float resultVaryingCoord;
  float resultFixedCoord;
  float varyingDifference;
  float fixedDifference;
  int varyingCoordNdx;
  int fixedCoordNdx;
  float axisCoord_local;
  bool isXAxis_local;
  Vec2 *pb_local;
  Vec2 *pa_local;
  
  ndx = (uint)!isXAxis;
  ndx_00 = (uint)isXAxis;
  pfVar4 = Vector<float,_2>::operator[](pb,ndx);
  fVar6 = *pfVar4;
  pfVar4 = Vector<float,_2>::operator[](pa,ndx);
  fVar7 = *pfVar4;
  pfVar4 = Vector<float,_2>::operator[](pb,ndx_00);
  fVar1 = *pfVar4;
  pfVar4 = Vector<float,_2>::operator[](pa,ndx_00);
  fVar2 = *pfVar4;
  pfVar4 = Vector<float,_2>::operator[](pa,ndx_00);
  fVar5 = *pfVar4;
  pfVar4 = Vector<float,_2>::operator[](pa,ndx);
  fVar5 = (axisCoord - *pfVar4) * ((fVar1 - fVar2) / (fVar6 - fVar7)) + fVar5;
  if (isXAxis) {
    Vector<float,_2>::Vector((Vector<float,_2> *)this,axisCoord,fVar5);
    fVar6 = extraout_XMM0_Da;
    fVar7 = extraout_XMM0_Db;
  }
  else {
    Vector<float,_2>::Vector((Vector<float,_2> *)this,fVar5,axisCoord);
    fVar6 = extraout_XMM0_Da_00;
    fVar7 = extraout_XMM0_Db_00;
  }
  VVar3.m_data[1] = fVar7;
  VVar3.m_data[0] = fVar6;
  return (Vec2)VVar3.m_data;
}

Assistant:

tcu::Vec2 getLineCoordAtAxisCoord (const tcu::Vec2& pa, const tcu::Vec2& pb, bool isXAxis, float axisCoord)
{
	const int	fixedCoordNdx		= (isXAxis) ? (0) : (1);
	const int	varyingCoordNdx		= (isXAxis) ? (1) : (0);

	const float	fixedDifference		= pb[fixedCoordNdx] - pa[fixedCoordNdx];
	const float	varyingDifference	= pb[varyingCoordNdx] - pa[varyingCoordNdx];

	DE_ASSERT(fixedDifference != 0.0f);

	const float	resultFixedCoord	= axisCoord;
	const float	resultVaryingCoord	= pa[varyingCoordNdx] + (axisCoord - pa[fixedCoordNdx]) * (varyingDifference / fixedDifference);

	return (isXAxis) ? (tcu::Vec2(resultFixedCoord, resultVaryingCoord))
					 : (tcu::Vec2(resultVaryingCoord, resultFixedCoord));
}